

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flecs.hpp
# Opt level: O3

void __thiscall
flecs::query<Position,_Asteroid>::query(query<Position,_Asteroid> *this,world *world)

{
  ecs_world_t *world_00;
  bool bVar1;
  ecs_query_t *peVar2;
  stringstream str;
  char *local_1c0;
  char local_1b0 [16];
  stringstream local_1a0 [128];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  bVar1 = _::pack_args_to_string<Position,Asteroid>(world->m_world,(stringstream *)local_1a0,true);
  if (bVar1) {
    world_00 = world->m_world;
    (this->super_query_base).m_world = world_00;
    std::__cxx11::stringbuf::str();
    peVar2 = ecs_query_new(world_00,local_1c0);
    (this->super_query_base).m_query = peVar2;
    if (local_1c0 != local_1b0) {
      operator_delete(local_1c0);
    }
    std::__cxx11::stringstream::~stringstream(local_1a0);
    std::ios_base::~ios_base(local_120);
    return;
  }
  _ecs_abort(2,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
             ,0x10c9);
  abort();
}

Assistant:

explicit query(const world& world) {
        std::stringstream str;
        if (!_::pack_args_to_string<Components...>(world.c_ptr(), str, true)) {
            ecs_abort(ECS_INVALID_PARAMETER, NULL);
        }

        m_world = world.c_ptr();
        m_query = ecs_query_new(world.c_ptr(), str.str().c_str());
    }